

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infowin_set_mask(long mask)

{
  long mask_local;
  
  Infowin->mask = mask;
  XSelectInput(Metadpy->dpy,Infowin->win,Infowin->mask);
  return 0;
}

Assistant:

static errr Infowin_set_mask(long mask)
{
	/* Save the new setting */
	Infowin->mask = mask;

	/* Execute the Mapping */
	XSelectInput(Metadpy->dpy, Infowin->win, Infowin->mask);

	/* Success */
	return (0);
}